

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O1

bool cmCMakeHostSystemInformationCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pbVar3;
  void *__s1;
  long lVar4;
  string_view separator;
  string_view name;
  string_view name_00;
  string *name_01;
  char cVar5;
  int iVar6;
  uint uVar7;
  const_iterator cVar8;
  _Rb_tree_node_base *p_Var9;
  _anonymous_namespace_ *p_Var10;
  optional<cmWindowsRegistry::View> oVar11;
  size_t value_00;
  size_t value_01;
  char *value_02;
  size_t value_03;
  size_t value_04;
  size_t value_05;
  size_t value_06;
  size_t value_07;
  size_t value_08;
  size_t value_09;
  size_t value_10;
  size_t value_11;
  size_t value_12;
  size_t value_13;
  size_t value_14;
  size_t value_15;
  size_t value_16;
  size_t value_17;
  char *value_18;
  size_t value_19;
  char *value_20;
  char *value_21;
  char *value_22;
  char *value_23;
  char *value_24;
  cmExecutionStatus *status_00;
  _Storage<cmWindowsRegistry::View,_true> view;
  size_type __rlen;
  ulong uVar12;
  cmMakefile *__rhs;
  bool bVar13;
  bool bVar14;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view sVar15;
  string_view value_25;
  string_view separator_00;
  string_view key;
  string_view value_26;
  string_view key_00;
  string_view value_27;
  string_view key_01;
  string_view value_28;
  string_view name_08;
  basic_string_view<char,_std::char_traits<char>_> __str;
  cmWindowsRegistry registry;
  Arguments arguments;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  invalidArgs;
  string vars;
  string result_list;
  string cmake_var_name;
  cmArgumentParser<Arguments> parser;
  size_t in_stack_fffffffffffffd28;
  char *in_stack_fffffffffffffd30;
  string local_2c8;
  char local_2a8;
  cmMakefile *local_2a0;
  undefined1 local_298 [8];
  undefined8 local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Any_data *local_278;
  size_t local_270;
  _Base_ptr local_268;
  size_t local_260;
  pointer local_258 [2];
  undefined2 local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  char *local_220;
  pointer local_218;
  char local_210;
  undefined7 uStack_20f;
  string local_200;
  string local_1e0;
  char local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  string *psStack_190;
  size_t local_188;
  char *pcStack_180;
  _Any_data local_178;
  _Manager_type local_168;
  _Invoker_type p_Stack_160;
  bool local_158;
  pointer local_150;
  key_type local_148;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  char *local_108;
  size_t local_100;
  char local_f8;
  undefined7 uStack_f7;
  string local_e8;
  string *local_c8;
  string *local_c0;
  cmMakefile *local_b8;
  ulong local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Any_data *local_98;
  _Any_data _Stack_90;
  code *pcStack_80;
  undefined8 local_78;
  _Any_data _Stack_70;
  code *pcStack_60;
  undefined8 local_58;
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  vStack_50;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar12 = (long)pbVar3 - (long)pbVar2 >> 5;
  if (((uVar12 < 2) || (pbVar2->_M_string_length != 6)) ||
     (iVar6 = bcmp((pbVar2->_M_dataplus)._M_p,"RESULT",6), iVar6 != 0)) {
    local_298 = (undefined1  [8])(local_298 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"missing RESULT specification.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0032c7a2:
    if (local_298 != (undefined1  [8])(local_298 + 0x10)) {
      operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
    }
    return false;
  }
  if (((uVar12 < 4) || (pbVar2[2]._M_string_length != 5)) ||
     (iVar6 = bcmp(pbVar2[2]._M_dataplus._M_p,"QUERY",5), iVar6 != 0)) {
    local_298 = (undefined1  [8])(local_298 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"missing QUERY specification","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_0032c7a2;
  }
  name_01 = pbVar2 + 1;
  local_150 = pbVar2;
  if ((pbVar2[3]._M_string_length != 0x10) ||
     (iVar6 = bcmp(pbVar2[3]._M_dataplus._M_p,"WINDOWS_REGISTRY",0x10), iVar6 != 0)) {
    if ((cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::info == '\0') &&
       (iVar6 = __cxa_guard_acquire(&cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::info), iVar6 != 0)) {
      cmsys::SystemInformation::SystemInformation(&cmCMakeHostSystemInformationCommand::info);
      __cxa_atexit(cmsys::SystemInformation::~SystemInformation,
                   &cmCMakeHostSystemInformationCommand::info,&__dso_handle);
      __cxa_guard_release(&cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::info);
    }
    local_c8 = name_01;
    if (cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::initialized == '\0') {
      cmsys::SystemInformation::RunCPUCheck(&cmCMakeHostSystemInformationCommand::info);
      cmsys::SystemInformation::RunOSCheck(&cmCMakeHostSystemInformationCommand::info);
      cmsys::SystemInformation::RunMemoryCheck(&cmCMakeHostSystemInformationCommand::info);
      cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::initialized = '\x01';
    }
    local_108 = &local_f8;
    local_100 = 0;
    local_f8 = '\0';
    bVar13 = (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) < 0x80;
    if (!bVar13) {
      local_c0 = (string *)&status->Error;
      uVar12 = 3;
      do {
        std::__cxx11::string::_M_append
                  ((char *)&local_108,
                   (&(anonymous_namespace)::DELIM_abi_cxx11_)[(ulong)(local_100 != 0) * 4]);
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_2a0 = (cmMakefile *)(uVar12 * 0x20);
        __s1 = *(void **)((long)&(pbVar2->_M_dataplus)._M_p +
                         (long)&(local_2a0->FindPackageRootPathStack).
                                super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_map);
        lVar4 = *(long *)((long)&(local_2a0->FindPackageRootPathStack).
                                 super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_map +
                         (long)&pbVar2->_M_string_length);
        local_b0 = uVar12;
        if ((lVar4 == 0x17) && (iVar6 = bcmp(__s1,"NUMBER_OF_LOGICAL_CORES",0x17), iVar6 == 0)) {
          uVar7 = cmsys::SystemInformation::GetNumberOfLogicalCPU
                            (&cmCMakeHostSystemInformationCommand::info);
          (anonymous_namespace)::ValueToString_abi_cxx11_
                    ((string *)local_298,(_anonymous_namespace_ *)(ulong)uVar7,value_00);
LAB_0032cf55:
          if (local_298 == (undefined1  [8])(local_298 + 0x10)) {
LAB_0032cf7d:
            local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
            local_2c8.field_2._M_allocated_capacity._4_4_ = local_288._M_allocated_capacity._4_4_;
            local_2c8.field_2._M_allocated_capacity._0_4_ = local_288._M_allocated_capacity._0_4_;
            local_2c8.field_2._12_4_ = local_288._12_4_;
            local_2c8.field_2._8_4_ = local_288._8_4_;
          }
          else {
LAB_0032cf69:
            local_2c8._M_dataplus._M_p = (pointer)local_298;
            local_2c8.field_2._M_allocated_capacity = local_288._M_allocated_capacity;
          }
          local_2c8._M_string_length = (size_type)local_290;
          local_2a8 = '\x01';
        }
        else {
          if ((lVar4 == 0x18) && (iVar6 = bcmp(__s1,"NUMBER_OF_PHYSICAL_CORES",0x18), iVar6 == 0)) {
            uVar7 = cmsys::SystemInformation::GetNumberOfPhysicalCPU
                              (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_298,(_anonymous_namespace_ *)(ulong)uVar7,value_01);
            goto LAB_0032cf55;
          }
          if ((lVar4 == 8) && (iVar6 = bcmp(__s1,"HOSTNAME",8), iVar6 == 0)) {
            p_Var10 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetHostname
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_298,p_Var10,value_02);
            goto LAB_0032cf55;
          }
          if (lVar4 == 0x14) {
            iVar6 = bcmp(__s1,"TOTAL_VIRTUAL_MEMORY",0x14);
            if (iVar6 != 0) goto LAB_0032ca20;
            p_Var10 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetTotalVirtualMemory
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_298,p_Var10,value_03);
            goto LAB_0032cf55;
          }
          if ((lVar4 != 4) || (iVar6 = bcmp(__s1,"FQDN",4), iVar6 != 0)) {
LAB_0032ca20:
            if ((lVar4 == 0x18) && (iVar6 = bcmp(__s1,"AVAILABLE_VIRTUAL_MEMORY",0x18), iVar6 == 0))
            {
              p_Var10 = (_anonymous_namespace_ *)
                        cmsys::SystemInformation::GetAvailableVirtualMemory
                                  (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_298,p_Var10,value_04);
              goto LAB_0032cf55;
            }
            if ((lVar4 == 0x15) && (iVar6 = bcmp(__s1,"TOTAL_PHYSICAL_MEMORY",0x15), iVar6 == 0)) {
              p_Var10 = (_anonymous_namespace_ *)
                        cmsys::SystemInformation::GetTotalPhysicalMemory
                                  (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_298,p_Var10,value_05);
              goto LAB_0032cf55;
            }
            if ((lVar4 == 0x19) && (iVar6 = bcmp(__s1,"AVAILABLE_PHYSICAL_MEMORY",0x19), iVar6 == 0)
               ) {
              p_Var10 = (_anonymous_namespace_ *)
                        cmsys::SystemInformation::GetAvailablePhysicalMemory
                                  (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_298,p_Var10,value_06);
              goto LAB_0032cf55;
            }
            if ((lVar4 == 8) && (iVar6 = bcmp(__s1,"IS_64BIT",8), iVar6 == 0)) {
              bVar14 = cmsys::SystemInformation::Is64Bits
                                 (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_298,(_anonymous_namespace_ *)(ulong)bVar14,value_07);
              goto LAB_0032cf55;
            }
            if (lVar4 == 7) {
              iVar6 = bcmp(__s1,"HAS_FPU",7);
              if (iVar6 == 0) {
                bVar14 = cmsys::SystemInformation::DoesCPUSupportFeature
                                   (&cmCMakeHostSystemInformationCommand::info,0x800000);
                (anonymous_namespace)::ValueToString_abi_cxx11_
                          ((string *)local_298,(_anonymous_namespace_ *)(ulong)bVar14,value_08);
              }
              else {
                iVar6 = bcmp(__s1,"HAS_MMX",7);
                if (iVar6 != 0) goto LAB_0032cada;
                bVar14 = cmsys::SystemInformation::DoesCPUSupportFeature
                                   (&cmCMakeHostSystemInformationCommand::info,1);
                (anonymous_namespace)::ValueToString_abi_cxx11_
                          ((string *)local_298,(_anonymous_namespace_ *)(ulong)bVar14,value_10);
              }
              goto LAB_0032cf55;
            }
LAB_0032cada:
            if ((lVar4 == 0xc) && (iVar6 = bcmp(__s1,"HAS_MMX_PLUS",0xc), iVar6 == 0)) {
              bVar14 = cmsys::SystemInformation::DoesCPUSupportFeature
                                 (&cmCMakeHostSystemInformationCommand::info,2);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_298,(_anonymous_namespace_ *)(ulong)bVar14,value_09);
              goto LAB_0032cf55;
            }
            if ((lVar4 == 7) && (iVar6 = bcmp(__s1,"HAS_SSE",7), iVar6 == 0)) {
              bVar14 = cmsys::SystemInformation::DoesCPUSupportFeature
                                 (&cmCMakeHostSystemInformationCommand::info,4);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_298,(_anonymous_namespace_ *)(ulong)bVar14,value_11);
              goto LAB_0032cf55;
            }
            if ((lVar4 == 8) && (iVar6 = bcmp(__s1,"HAS_SSE2",8), iVar6 == 0)) {
              bVar14 = cmsys::SystemInformation::DoesCPUSupportFeature
                                 (&cmCMakeHostSystemInformationCommand::info,8);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_298,(_anonymous_namespace_ *)(ulong)bVar14,value_12);
            }
            else if ((lVar4 == 10) && (iVar6 = bcmp(__s1,"HAS_SSE_FP",10), iVar6 == 0)) {
              bVar14 = cmsys::SystemInformation::DoesCPUSupportFeature
                                 (&cmCMakeHostSystemInformationCommand::info,0x800);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_298,(_anonymous_namespace_ *)(ulong)bVar14,value_13);
            }
            else if ((lVar4 == 0xb) && (iVar6 = bcmp(__s1,"HAS_SSE_MMX",0xb), iVar6 == 0)) {
              bVar14 = cmsys::SystemInformation::DoesCPUSupportFeature
                                 (&cmCMakeHostSystemInformationCommand::info,0x1000);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_298,(_anonymous_namespace_ *)(ulong)bVar14,value_14);
            }
            else if (lVar4 == 0x12) {
              iVar6 = bcmp(__s1,"HAS_AMD_3DNOW_PLUS",0x12);
              if (iVar6 != 0) goto LAB_0032cbc0;
              bVar14 = cmsys::SystemInformation::DoesCPUSupportFeature
                                 (&cmCMakeHostSystemInformationCommand::info,0x20);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_298,(_anonymous_namespace_ *)(ulong)bVar14,value_15);
            }
            else if ((lVar4 == 0xd) && (iVar6 = bcmp(__s1,"HAS_AMD_3DNOW",0xd), iVar6 == 0)) {
              bVar14 = cmsys::SystemInformation::DoesCPUSupportFeature
                                 (&cmCMakeHostSystemInformationCommand::info,0x10);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_298,(_anonymous_namespace_ *)(ulong)bVar14,value_17);
            }
            else {
LAB_0032cbc0:
              if ((lVar4 == 8) && (iVar6 = bcmp(__s1,"HAS_IA64",8), iVar6 == 0)) {
                bVar14 = cmsys::SystemInformation::DoesCPUSupportFeature
                                   (&cmCMakeHostSystemInformationCommand::info,0x40);
                (anonymous_namespace)::ValueToString_abi_cxx11_
                          ((string *)local_298,(_anonymous_namespace_ *)(ulong)bVar14,value_16);
              }
              else if (lVar4 == 0xe) {
                iVar6 = bcmp(__s1,"PROCESSOR_NAME",0xe);
                if (iVar6 != 0) goto LAB_0032cc26;
                p_Var10 = (_anonymous_namespace_ *)
                          cmsys::SystemInformation::GetExtendedProcessorName
                                    (&cmCMakeHostSystemInformationCommand::info);
                (anonymous_namespace)::ValueToString_abi_cxx11_
                          ((string *)local_298,p_Var10,value_18);
              }
              else if ((lVar4 == 0x11) && (iVar6 = bcmp(__s1,"HAS_SERIAL_NUMBER",0x11), iVar6 == 0))
              {
                bVar14 = cmsys::SystemInformation::DoesCPUSupportFeature
                                   (&cmCMakeHostSystemInformationCommand::info,0x200);
                (anonymous_namespace)::ValueToString_abi_cxx11_
                          ((string *)local_298,(_anonymous_namespace_ *)(ulong)bVar14,value_19);
              }
              else {
LAB_0032cc26:
                if ((lVar4 == 0x15) && (iVar6 = bcmp(__s1,"PROCESSOR_DESCRIPTION",0x15), iVar6 == 0)
                   ) {
                  cmsys::SystemInformation::GetCPUDescription_abi_cxx11_
                            ((string *)local_298,&cmCMakeHostSystemInformationCommand::info);
                }
                else if ((lVar4 == 0x17) &&
                        (iVar6 = bcmp(__s1,"PROCESSOR_SERIAL_NUMBER",0x17), iVar6 == 0)) {
                  p_Var10 = (_anonymous_namespace_ *)
                            cmsys::SystemInformation::GetProcessorSerialNumber
                                      (&cmCMakeHostSystemInformationCommand::info);
                  (anonymous_namespace)::ValueToString_abi_cxx11_
                            ((string *)local_298,p_Var10,value_20);
                }
                else {
                  if ((lVar4 != 7) || (iVar6 = bcmp(__s1,"OS_NAME",7), iVar6 != 0)) {
                    if (lVar4 == 10) {
                      iVar6 = bcmp(__s1,"OS_RELEASE",10);
                      if (iVar6 == 0) {
                        p_Var10 = (_anonymous_namespace_ *)
                                  cmsys::SystemInformation::GetOSRelease
                                            (&cmCMakeHostSystemInformationCommand::info);
                        (anonymous_namespace)::ValueToString_abi_cxx11_
                                  ((string *)local_298,p_Var10,value_22);
                        goto LAB_0032d6b0;
                      }
                      iVar6 = bcmp(__s1,"OS_VERSION",10);
                      if (iVar6 != 0) goto LAB_0032ccc0;
                      p_Var10 = (_anonymous_namespace_ *)
                                cmsys::SystemInformation::GetOSVersion
                                          (&cmCMakeHostSystemInformationCommand::info);
                      (anonymous_namespace)::ValueToString_abi_cxx11_
                                ((string *)local_298,p_Var10,value_24);
                    }
                    else {
LAB_0032ccc0:
                      if ((lVar4 != 0xb) || (iVar6 = bcmp(__s1,"OS_PLATFORM",0xb), iVar6 != 0)) {
                        local_2a8 = '\0';
                        goto LAB_0032cf91;
                      }
                      p_Var10 = (_anonymous_namespace_ *)
                                cmsys::SystemInformation::GetOSPlatform
                                          (&cmCMakeHostSystemInformationCommand::info);
                      (anonymous_namespace)::ValueToString_abi_cxx11_
                                ((string *)local_298,p_Var10,value_23);
                    }
                    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
                    if (local_298 == (undefined1  [8])(local_298 + 0x10)) {
                      local_2c8.field_2._8_8_ = local_288._8_8_;
                    }
                    else {
                      local_2c8._M_dataplus._M_p = (pointer)local_298;
                    }
                    local_2c8.field_2._M_allocated_capacity = local_288._M_allocated_capacity;
                    local_2c8._M_string_length = (size_type)local_290;
                    local_2a8 = '\x01';
                    goto LAB_0032cf91;
                  }
                  p_Var10 = (_anonymous_namespace_ *)
                            cmsys::SystemInformation::GetOSName
                                      (&cmCMakeHostSystemInformationCommand::info);
                  (anonymous_namespace)::ValueToString_abi_cxx11_
                            ((string *)local_298,p_Var10,value_21);
                }
              }
            }
LAB_0032d6b0:
            if (local_298 == (undefined1  [8])(local_298 + 0x10)) {
              goto LAB_0032cf7d;
            }
            goto LAB_0032cf69;
          }
          cmsys::SystemInformation::GetFullyQualifiedDomainName_abi_cxx11_
                    ((string *)&local_a8,&cmCMakeHostSystemInformationCommand::info);
          paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_298 + 0x10);
          local_298 = (undefined1  [8])paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_298,local_a8._M_allocated_capacity,
                     (undefined1 *)(local_a8._M_allocated_capacity + local_a8._8_8_));
          if (local_298 == (undefined1  [8])paVar1) {
            local_2c8.field_2._8_8_ = local_288._8_8_;
            local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          }
          else {
            local_2c8._M_dataplus._M_p = (pointer)local_298;
          }
          local_2c8.field_2._M_allocated_capacity = local_288._M_allocated_capacity;
          local_2c8._M_string_length = (size_type)local_290;
          local_290 = (pointer)0x0;
          local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
          local_2a8 = '\x01';
          local_298 = (undefined1  [8])paVar1;
          if ((_Any_data **)local_a8._M_allocated_capacity != &local_98) {
            operator_delete((void *)local_a8._M_allocated_capacity,(long)local_98 + 1);
          }
        }
LAB_0032cf91:
        __rhs = (cmMakefile *)
                ((long)&(local_2a0->FindPackageRootPathStack).
                        super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_map + (long)&(pbVar2->_M_dataplus)._M_p);
        if (local_2a8 == '\x01') {
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p == &local_2c8.field_2) {
            local_1e0.field_2._8_8_ = local_2c8.field_2._8_8_;
          }
          else {
            local_1e0._M_dataplus._M_p = local_2c8._M_dataplus._M_p;
          }
          local_1e0.field_2._M_allocated_capacity = local_2c8.field_2._M_allocated_capacity;
          local_1e0._M_string_length = local_2c8._M_string_length;
          local_2c8._M_string_length = 0;
          local_2c8.field_2._M_allocated_capacity =
               local_2c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1c0 = '\x01';
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        }
        else {
          local_290 = (pointer)(__rhs->FindPackageRootPathStack).
                               super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_map;
          local_298 = (undefined1  [8])
                      (__rhs->FindPackageRootPathStack).
                      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map_size;
          p_Var10 = (_anonymous_namespace_ *)0x0;
          __str._M_str = "DISTRIB_";
          __str._M_len = 8;
          iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_298,0,8,__str
                            );
          if (iVar6 == 0) {
            local_2a0 = __rhs;
            if (((anonymous_namespace)::
                 GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                 ::s_os_release_abi_cxx11_ == '\0') &&
               (iVar6 = __cxa_guard_acquire(&(anonymous_namespace)::
                                             GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                             ::s_os_release_abi_cxx11_), iVar6 != 0)) {
              (anonymous_namespace)::GetOSReleaseVariables_abi_cxx11_
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)status,p_Var10,status_00);
              __cxa_atexit(std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::~map,(anonymous_namespace)::
                                  GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                  ::s_os_release_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&(anonymous_namespace)::
                                   GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::s_os_release_abi_cxx11_);
              __rhs = local_2a0;
            }
            local_b8 = status->Makefile;
            std::__cxx11::string::substr((ulong)&local_148,(ulong)__rhs);
            if ((local_148._M_string_length == 4) &&
               (iVar6 = bcmp(local_148._M_dataplus._M_p,"INFO",4), iVar6 == 0)) {
              local_128.Begin._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118;
              local_128.End._M_current = (pointer)0x0;
              local_118._M_local_buf[0] = '\0';
              for (p_Var9 = (_Rb_tree_node_base *)
                            (anonymous_namespace)::
                            GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                            ::s_os_release_abi_cxx11_._24_8_;
                  p_Var9 != (_Rb_tree_node_base *)
                            ((anonymous_namespace)::
                             GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                             ::s_os_release_abi_cxx11_ + 8);
                  p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
                local_290 = (pointer)local_150[1]._M_dataplus._M_p;
                local_298 = (undefined1  [8])local_150[1]._M_string_length;
                local_288._M_allocated_capacity = 0;
                local_a8._M_allocated_capacity = 0;
                local_a8._8_8_ = &DAT_00000001;
                local_278 = &_Stack_90;
                _Stack_90._M_pod_data[0] = 0x5f;
                local_288._8_8_ = &DAT_00000001;
                local_270 = 0;
                local_260 = *(size_t *)(p_Var9 + 1);
                local_268 = p_Var9[1]._M_parent;
                local_258[0] = (pointer)0x0;
                views._M_len = 3;
                views._M_array = (iterator)local_298;
                local_98 = local_278;
                cmCatViews(&local_e8,views);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_298,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (&(anonymous_namespace)::DELIM_abi_cxx11_ +
                               (ulong)(local_128.End._M_current != (pointer)0x0) * 4),&local_e8);
                std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_298);
                __rhs = local_2a0;
                if (local_298 != (undefined1  [8])(local_298 + 0x10)) {
                  operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
                }
                sVar15._M_str = *(char **)(p_Var9 + 2);
                sVar15._M_len = (size_t)p_Var9[2]._M_parent;
                cmMakefile::AddDefinition(local_b8,&local_e8,sVar15);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
              }
              local_1b8._0_8_ = &local_1a8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128.Begin._M_current == &local_118) {
                local_1a8._8_8_ = local_118._8_8_;
              }
              else {
                local_1b8._0_8_ = local_128.Begin._M_current;
              }
              local_1a8._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
              local_1a8._M_local_buf[0] = local_118._M_local_buf[0];
              local_1b8._8_8_ = local_128.End._M_current;
            }
            else {
              cVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)(anonymous_namespace)::
                                GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                ::s_os_release_abi_cxx11_,&local_148);
              local_1b8._0_8_ = &local_1a8;
              if (cVar8._M_node ==
                  (_Base_ptr)
                  ((anonymous_namespace)::
                   GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                   ::s_os_release_abi_cxx11_ + 8)) {
                local_298 = (undefined1  [8])(local_298 + 0x10);
                local_290 = (pointer)0x0;
                local_288._M_allocated_capacity =
                     local_288._M_allocated_capacity & 0xffffffffffffff00;
                local_1a8._M_allocated_capacity = local_288._M_allocated_capacity;
                local_1a8._8_8_ = local_288._8_8_;
                local_1b8._8_8_ = (pointer)0x0;
              }
              else {
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1b8,*(long *)(cVar8._M_node + 2),
                           (long)&(cVar8._M_node[2]._M_parent)->_M_color +
                           *(long *)(cVar8._M_node + 2));
              }
            }
            local_198 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_198._1_7_,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            local_198 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((ulong)local_198 & 0xffffffffffffff00);
          }
          if (local_198._0_1_ == true) {
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_ == &local_1a8) {
              local_1e0.field_2._8_8_ = local_1a8._8_8_;
            }
            else {
              local_1e0._M_dataplus._M_p = (pointer)local_1b8._0_8_;
            }
            local_1e0.field_2._M_allocated_capacity = local_1a8._M_allocated_capacity;
            local_1e0._M_string_length = local_1b8._8_8_;
            local_1b8._8_8_ = (pointer)0x0;
            local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
            local_1c0 = '\x01';
            local_1b8._0_8_ = &local_1a8;
          }
          else {
            local_1c0 = '\0';
          }
          if ((local_198._0_1_ != false) &&
             (local_198 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((ulong)local_198 & 0xffffffffffffff00),
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_1b8._0_8_ != &local_1a8)) {
            operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
          }
        }
        if ((local_2a8 == '\x01') &&
           (local_2a8 = '\0',
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_2c8._M_dataplus._M_p != &local_2c8.field_2)) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        cVar5 = local_1c0;
        if (local_1c0 == '\0') {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_298,"does not recognize <key> ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
          ;
          std::__cxx11::string::_M_assign(local_c0);
          if (local_298 != (undefined1  [8])(local_298 + 0x10)) {
            operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_1e0._M_dataplus._M_p);
        }
        if ((local_1c0 == '\x01') &&
           (local_1c0 = '\0',
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1e0._M_dataplus._M_p != &local_1e0.field_2)) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if (cVar5 == '\0') goto LAB_0032c8eb;
        uVar12 = local_b0 + 1;
        bVar14 = uVar12 < (ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5);
        bVar13 = !bVar14;
      } while (bVar14);
    }
    value_25._M_str = local_108;
    value_25._M_len = local_100;
    cmMakefile::AddDefinition(status->Makefile,local_c8,value_25);
LAB_0032c8eb:
    if (local_108 == &local_f8) {
      return bVar13;
    }
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
    return bVar13;
  }
  local_128.Begin._M_current = pbVar2 + 4;
  local_128.End._M_current = pbVar3;
  if (local_128.Begin._M_current == pbVar3) {
    local_298 = (undefined1  [8])(local_298 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"missing <key> specification.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_0032c7a2;
  }
  vStack_50.
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_50.
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = 0;
  vStack_50.
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_70._8_8_ = 0;
  pcStack_60 = (code *)0x0;
  local_78 = 0;
  _Stack_70._M_unused._M_object = (void *)0x0;
  _Stack_90._8_8_ = 0;
  pcStack_80 = (code *)0x0;
  local_98 = (_Any_data *)0x0;
  _Stack_90._M_unused._M_object = (void *)0x0;
  local_a8._M_allocated_capacity = 0;
  local_a8._8_8_ = 0;
  name_02.super_string_view._M_str = "VALUE";
  name_02.super_string_view._M_len = 5;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_a8._M_local_buf,name_02,0x30);
  name_03.super_string_view._M_str = "VALUE_NAMES";
  name_03.super_string_view._M_len = 0xb;
  cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&local_a8,name_03,0x50);
  name_04.super_string_view._M_str = "SUBKEYS";
  name_04.super_string_view._M_len = 7;
  cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&local_a8,name_04,0x51);
  name_05.super_string_view._M_str = "VIEW";
  name_05.super_string_view._M_len = 4;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_a8._M_local_buf,name_05,0x58);
  name_06.super_string_view._M_str = "SEPARATOR";
  name_06.super_string_view._M_len = 9;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_a8._M_local_buf,name_06,0x78);
  name_07.super_string_view._M_str = "ERROR_VARIABLE";
  name_07.super_string_view._M_len = 0xe;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_a8._M_local_buf,name_07,0x98);
  local_1a8._M_allocated_capacity = (size_type)&local_148;
  local_148._M_dataplus._M_p = (pointer)0x0;
  local_148._M_string_length = 0;
  local_128.Begin._M_current = local_128.Begin._M_current + 1;
  local_148.field_2._M_allocated_capacity = 0;
  local_288._8_8_ = local_298 + 8;
  local_290 = (pointer)((ulong)local_290._4_4_ << 0x20);
  local_288._M_allocated_capacity = 0;
  local_270 = 0;
  local_260 = 0;
  local_258[0] = (pointer)((ulong)local_258[0] & 0xffffffffffffff00);
  local_248 = 0;
  local_240._M_string_length = 0;
  local_240.field_2._M_local_buf[0] = '\0';
  local_220 = &local_210;
  local_218 = (pointer)0x0;
  local_210 = '\0';
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  local_1b8._8_8_ = local_298;
  local_198 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  psStack_190 = (string *)0x0;
  local_188 = 0;
  pcStack_180 = (char *)0x0;
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  local_168 = (_Manager_type)0x0;
  p_Stack_160 = (_Invoker_type)0x0;
  local_158 = false;
  local_278 = (_Any_data *)local_288._8_8_;
  local_268 = (_Base_ptr)local_258;
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_1b8._0_8_ = &local_a8;
  local_1a8._8_8_ = local_1b8._8_8_;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_1b8,&local_128,0);
  if (local_168 != (_Manager_type)0x0) {
    (*local_168)(&local_178,&local_178,__destroy_functor);
  }
  if (local_148._M_dataplus._M_p != (pointer)local_148._M_string_length) {
    separator_00._M_str = ", ";
    separator_00._M_len = 2;
    cmJoin(&local_1e0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_148,separator_00,(string_view)ZEXT816(0));
    local_1b8._0_8_ = (pointer)0x1b;
    local_1b8._8_8_ = "given invalid argument(s) \"";
    local_1a8._M_allocated_capacity = 0;
    local_1a8._8_8_ = local_1e0._M_string_length;
    local_198 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p;
    local_188 = 2;
    pcStack_180 = "\".";
    local_178._M_unused._M_object = (void *)0x0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_1b8;
    psStack_190 = &local_1e0;
    cmCatViews(&local_2c8,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    bVar14 = false;
    goto LAB_0032de69;
  }
  bVar13 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_298,status->Makefile);
  bVar14 = true;
  if (bVar13) goto LAB_0032de69;
  if (local_260 == 0) {
    if (((char)local_248 != '\0') && (local_248._1_1_ == '\x01')) goto LAB_0032db0d;
LAB_0032db6c:
    if ((local_240._M_string_length == 0) ||
       (name._M_str = in_stack_fffffffffffffd30, name._M_len = in_stack_fffffffffffffd28,
       oVar11 = cmWindowsRegistry::ToView(name),
       ((ulong)oVar11.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
               super__Optional_payload_base<cmWindowsRegistry::View> >> 0x20 & 1) != 0)) {
      local_2a0 = status->Makefile;
      view._M_value = Both;
      cmMakefile::AddDefinition(local_2a0,name_01,(string_view)(ZEXT816(0x8a6a45) << 0x40));
      if (local_240._M_string_length != 0) {
        name_00._M_str = in_stack_fffffffffffffd30;
        name_00._M_len = in_stack_fffffffffffffd28;
        oVar11 = cmWindowsRegistry::ToView(name_00);
        view._M_value =
             oVar11.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
             super__Optional_payload_base<cmWindowsRegistry::View>._M_payload;
      }
      cmWindowsRegistry::cmWindowsRegistry
                ((cmWindowsRegistry *)&local_2c8,local_2a0,&cmWindowsRegistry::AllTypes);
      if ((char)local_248 == '\x01') {
        key._M_str = local_150[4]._M_dataplus._M_p;
        key._M_len = local_150[4]._M_string_length;
        cmWindowsRegistry::GetValueNames_abi_cxx11_
                  ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_1b8,(cmWindowsRegistry *)&local_2c8,key,view._M_value);
        if (local_1a8._M_local_buf[8] == '\x01') {
          cmList::
          to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                    (&local_1e0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1b8);
          value_26._M_str = local_1e0._M_dataplus._M_p;
          value_26._M_len = local_1e0._M_string_length;
          cmMakefile::AddDefinition(local_2a0,name_01,value_26);
LAB_0032dd16:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
          }
        }
LAB_0032dd37:
        if (local_1a8._M_local_buf[8] == '\x01') {
          local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
        }
      }
      else {
        if (local_248._1_1_ == '\x01') {
          key_00._M_str = local_150[4]._M_dataplus._M_p;
          key_00._M_len = local_150[4]._M_string_length;
          cmWindowsRegistry::GetSubKeys_abi_cxx11_
                    ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_1b8,(cmWindowsRegistry *)&local_2c8,key_00,view._M_value);
          if (local_1a8._M_local_buf[8] == '\x01') {
            cmList::
            to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                      (&local_1e0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1b8);
            value_27._M_str = local_1e0._M_dataplus._M_p;
            value_27._M_len = local_1e0._M_string_length;
            cmMakefile::AddDefinition(local_2a0,name_01,value_27);
            goto LAB_0032dd16;
          }
          goto LAB_0032dd37;
        }
        local_e8._M_dataplus._M_p = local_218;
        local_e8._M_string_length = (size_type)local_220;
        separator._M_str = local_220;
        separator._M_len = (size_t)local_218;
        key_01._M_str = local_150[4]._M_dataplus._M_p;
        key_01._M_len = local_150[4]._M_string_length;
        name_08._M_str = (char *)local_268;
        name_08._M_len = local_260;
        cmWindowsRegistry::ReadValue_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1b8,(cmWindowsRegistry *)&local_2c8,key_01,name_08,view._M_value,
                   separator);
        if (local_198._0_1_ == true) {
          value_28._M_str = (char *)local_1b8._0_8_;
          value_28._M_len = local_1b8._8_8_;
          cmMakefile::AddDefinition(local_2a0,name_01,value_28);
        }
        if ((local_198._0_1_ == true) &&
           (local_198 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((ulong)local_198 & 0xffffffffffffff00),
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1b8._0_8_ != &local_1a8)) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
        }
      }
      if (local_200._M_string_length != 0) {
        sVar15 = cmWindowsRegistry::GetLastError((cmWindowsRegistry *)&local_2c8);
        cmMakefile::AddDefinition(local_2a0,&local_200,sVar15);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0032de69;
    }
    local_2c8._M_dataplus._M_p._0_1_ = 0x2e;
    cmStrCat<char_const(&)[33],std::__cxx11::string_const&,char>
              ((string *)local_1b8,(char (*) [33])"given invalid value for \"VIEW\": ",&local_240,
               (char *)&local_2c8);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != &local_1a8) {
LAB_0032db55:
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
    }
  }
  else {
    if (((char)local_248 == '\0') && (local_248._1_1_ == '\0')) goto LAB_0032db6c;
LAB_0032db0d:
    local_1b8._0_8_ = &local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,
               "given mutually exclusive sub-options \"VALUE\", \"VALUE_NAMES\" or \"SUBKEYS\".","")
    ;
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != &local_1a8) goto LAB_0032db55;
  }
  bVar14 = false;
LAB_0032de69:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,
                    CONCAT71(local_200.field_2._M_allocated_capacity._1_7_,
                             local_200.field_2._M_local_buf[0]) + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,CONCAT71(uStack_20f,local_210) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,
                    CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                             local_240.field_2._M_local_buf[0]) + 1);
  }
  if (local_268 != (_Base_ptr)local_258) {
    operator_delete(local_268,(ulong)((long)&local_258[0]->first + 1));
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_148);
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector(&vStack_50);
  if (pcStack_60 != (code *)0x0) {
    (*pcStack_60)(&_Stack_70,&_Stack_70,__destroy_functor);
  }
  if (pcStack_80 != (code *)0x0) {
    (*pcStack_80)(&_Stack_90,&_Stack_90,__destroy_functor);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)&local_a8);
  return bVar14;
}

Assistant:

bool cmCMakeHostSystemInformationCommand(std::vector<std::string> const& args,
                                         cmExecutionStatus& status)
{
  std::size_t current_index = 0;

  if (args.size() < (current_index + 2) || args[current_index] != "RESULT"_s) {
    status.SetError("missing RESULT specification.");
    return false;
  }

  auto const& variable = args[current_index + 1];
  current_index += 2;

  if (args.size() < (current_index + 2) || args[current_index] != "QUERY"_s) {
    status.SetError("missing QUERY specification");
    return false;
  }

  if (args[current_index + 1] == "WINDOWS_REGISTRY"_s) {
    return QueryWindowsRegistry(cmMakeRange(args).advance(current_index + 2),
                                status, variable);
  }

  static cmsys::SystemInformation info;
  static auto initialized = false;
  if (!initialized) {
    info.RunCPUCheck();
    info.RunOSCheck();
    info.RunMemoryCheck();
    initialized = true;
  }

  std::string result_list;
  for (auto i = current_index + 1; i < args.size(); ++i) {
    result_list += DELIM[!result_list.empty()];

    auto const& key = args[i];
    // clang-format off
    auto value =
      GetValueChained(
          [&]() { return GetValue(info, key); }
        , [&]() { return GetDistribValue(status, key, variable); }
#ifdef _WIN32
        , [&]() { return GetWindowsValue(status, key); }
#endif
        );
    // clang-format on
    if (!value) {
      status.SetError("does not recognize <key> " + key);
      return false;
    }
    result_list += value.value();
  }

  status.GetMakefile().AddDefinition(variable, result_list);

  return true;
}